

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_json.cpp
# Opt level: O2

void __thiscall cppcms::rpc::json_call::json_call(json_call *this,context *c)

{
  _data *p_Var1;
  bool bVar2;
  json_type jVar3;
  request *prVar4;
  value *pvVar5;
  value *pvVar6;
  _Vector_impl_data *__x;
  call_error *pcVar7;
  undefined8 uVar8;
  pair<void_*,_unsigned_long> pVar9;
  allocator local_22d;
  undefined4 local_22c;
  value request;
  string local_220;
  content_type ct;
  string subtype;
  string type;
  istringstream ss;
  
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pvVar6 = &this->id_;
  json::value::copyable::copyable(&pvVar6->d);
  (this->params_).super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->params_).super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params_).super__Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->method_)._M_dataplus._M_p = (pointer)&(this->method_).field_2;
  (this->method_)._M_string_length = 0;
  (this->method_).field_2._M_local_buf[0] = '\0';
  (this->d).ptr_ = (_data *)0x0;
  http::context::request(c);
  http::request::content_type_parsed((request *)&ct);
  http::content_type::type_abi_cxx11_(&type,&ct);
  http::content_type::subtype_abi_cxx11_(&subtype,&ct);
  bVar2 = std::operator!=(&type,"application");
  if (!bVar2) {
    bVar2 = std::operator!=(&subtype,"json");
    if (bVar2) {
      bVar2 = std::operator!=(&subtype,"jsonrequest");
      if (bVar2) {
        bVar2 = std::operator!=(&subtype,"json-rpc");
        if (bVar2) goto LAB_0023edeb;
      }
    }
    prVar4 = http::context::request(c);
    http::request::request_method_abi_cxx11_((string *)&ss,prVar4);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss
                            ,"POST");
    std::__cxx11::string::~string((string *)&ss);
    if (bVar2) {
      pcVar7 = (call_error *)__cxa_allocate_exception(0x30);
      uVar8 = std::__cxx11::string::string
                        ((string *)&ss,"Invalid request method",(allocator *)&local_220);
      local_22c = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
      call_error::call_error(pcVar7,(string *)&ss);
      local_22c = 0;
      __cxa_throw(pcVar7,&call_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    prVar4 = http::context::request(c);
    pVar9 = http::request::raw_post_data(prVar4);
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_220,pVar9.first,pVar9.second + (long)pVar9.first);
    std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&local_220,_S_in);
    std::__cxx11::string::~string((string *)&local_220);
    json::value::copyable::copyable(&request.d);
    bVar2 = json::value::load(&request,(istream *)&ss,true,(int *)0x0);
    if (bVar2) {
      jVar3 = json::value::type(&request,"method");
      if (jVar3 == is_string) {
        jVar3 = json::value::type(&request,"params");
        if (jVar3 == is_array) {
          jVar3 = json::value::type(&request,"id");
          if (jVar3 != is_undefined) {
            jVar3 = json::value::type(&request,"id");
            if (jVar3 == is_null) {
              this->notification_ = true;
            }
            else {
              this->notification_ = false;
              std::__cxx11::string::string((string *)&local_220,"id",&local_22d);
              pvVar5 = json::value::operator[](&request,&local_220);
              p_Var1 = (pvVar5->d).d.ptr_;
              (pvVar5->d).d.ptr_ = (pvVar6->d).d.ptr_;
              (pvVar6->d).d.ptr_ = p_Var1;
              std::__cxx11::string::~string((string *)&local_220);
            }
            std::__cxx11::string::string((string *)&local_220,"params",&local_22d);
            pvVar6 = json::value::operator[](&request,&local_220);
            __x = (_Vector_impl_data *)json::value::array(pvVar6);
            std::_Vector_base<cppcms::json::value,_std::allocator<cppcms::json::value>_>::
            _Vector_impl_data::_M_swap_data((_Vector_impl_data *)&this->params_,__x);
            std::__cxx11::string::~string((string *)&local_220);
            json::value::get<std::__cxx11::string>(&local_220,&request,"method");
            std::__cxx11::string::operator=((string *)&this->method_,(string *)&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            json::value::copyable::~copyable(&request.d);
            std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
            std::__cxx11::string::~string((string *)&subtype);
            std::__cxx11::string::~string((string *)&type);
            http::content_type::~content_type(&ct);
            return;
          }
        }
      }
      pcVar7 = (call_error *)__cxa_allocate_exception(0x30);
      uVar8 = std::__cxx11::string::string((string *)&local_220,"Invalid JSON-RPC",&local_22d);
      local_22c = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
      call_error::call_error(pcVar7,&local_220);
      local_22c = 0;
      __cxa_throw(pcVar7,&call_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    pcVar7 = (call_error *)__cxa_allocate_exception(0x30);
    uVar8 = std::__cxx11::string::string((string *)&local_220,"Invalid JSON",&local_22d);
    local_22c = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
    call_error::call_error(pcVar7,&local_220);
    local_22c = 0;
    __cxa_throw(pcVar7,&call_error::typeinfo,booster::runtime_error::~runtime_error);
  }
LAB_0023edeb:
  pcVar7 = (call_error *)__cxa_allocate_exception(0x30);
  uVar8 = std::__cxx11::string::string((string *)&ss,"Invalid content type",(allocator *)&local_220)
  ;
  local_22c = (undefined4)CONCAT71((int7)((ulong)uVar8 >> 8),1);
  call_error::call_error(pcVar7,(string *)&ss);
  local_22c = 0;
  __cxa_throw(pcVar7,&call_error::typeinfo,booster::runtime_error::~runtime_error);
}

Assistant:

json_call::json_call(http::context &c) 
	{
		http::content_type ct = c.request().content_type_parsed();
		std::string type = ct.type();
		std::string subtype = ct.subtype();
		if(type != "application" || (subtype!="json" && subtype!="jsonrequest" && subtype!="json-rpc"))
			throw call_error("Invalid content type"); 
		if(c.request().request_method()!="POST")
			throw call_error("Invalid request method"); 
		std::pair<void *,size_t> post_data = c.request().raw_post_data();
		std::istringstream ss(std::string(reinterpret_cast<char const *>(post_data.first),post_data.second));
		json::value request;
		if(!request.load(ss,true))
			throw call_error("Invalid JSON");
		if(	request.type("method")!=json::is_string 
			|| request.type("params")!=json::is_array
			|| request.type("id")==json::is_undefined)
		{
			throw call_error("Invalid JSON-RPC");
		}
		if(request.type("id")==json::is_null) {
			notification_ = true;
		}
		else {
			notification_ = false;
			id_.swap(request["id"]);
		}
		params_.swap(request["params"].array());
		method_ = request.get<std::string>("method");
	}